

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

Pattern * __thiscall docopt::BranchPattern::fix(BranchPattern *this)

{
  undefined1 local_48 [8];
  UniquePatternSet patterns;
  
  local_48 = (undefined1  [8])&patterns._M_h._M_rehash_policy._M_next_resize;
  patterns._M_h._M_buckets = (__buckets_ptr)0x1;
  patterns._M_h._M_bucket_count = 0;
  patterns._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  patterns._M_h._M_element_count._0_4_ = 0x3f800000;
  patterns._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  patterns._M_h._M_rehash_policy._4_4_ = 0;
  patterns._M_h._M_rehash_policy._M_next_resize = 0;
  (*(this->super_Pattern)._vptr_Pattern[9])(this,local_48);
  fix_repeating_arguments(this);
  std::
  _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_48);
  return &this->super_Pattern;
}

Assistant:

Pattern& fix() {
			UniquePatternSet patterns;
			fix_identities(patterns);
			fix_repeating_arguments();
			return *this;
		}